

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processTimingTick(CommonCore *this,ActionMessage *cmd)

{
  FederateState *this_00;
  long lVar1;
  string_view message;
  string_view message_00;
  FederateStates FVar2;
  uint uVar3;
  long lVar4;
  string_view name;
  string_view name_00;
  const_iterator __end3;
  const_iterator __begin3;
  ActionMessage bye;
  
  if (((cmd->messageID & 3) != 0) && ((this->super_BrokerBase).brokerState._M_i == OPERATING)) {
    TimeoutMonitor::tick
              ((this->timeoutMon)._M_t.
               super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
               .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl,this);
    if (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
      message._M_str = " core tick";
      message._M_len = 10;
      name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (&this->super_BrokerBase,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,6,name,
                 message,false);
    }
  }
  uVar3 = cmd->messageID;
  if ((uVar3 & 4) != 0) {
    checkQueryTimeouts(this);
    uVar3 = cmd->messageID;
  }
  if ((uVar3 & 0x10) != 0) {
    lVar4 = std::chrono::_V2::steady_clock::now();
    lVar1 = (this->super_BrokerBase).tickTimer.internalTimeCode * 3;
    if (lVar1 - lVar1 % 1000000 < lVar4 - (this->super_BrokerBase).disconnectTime.__d.__r) {
      message_00._M_str = " disconnect Timer expired forcing disconnect";
      message_00._M_len = 0x2c;
      name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (&this->super_BrokerBase,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name_00,
                 message_00,false);
      ActionMessage::ActionMessage(&bye,cmd_disconnect_fed_ack);
      bye.source_id.gid = 0;
      gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
      begin(&__begin3,&(this->loopFederates).dataStorage);
      gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
      end(&__end3,&(this->loopFederates).dataStorage);
      while ((__begin3.offset != __end3.offset || (__begin3.vec != __end3.vec))) {
        this_00 = (__begin3.ptr)->fed;
        FVar2 = FederateState::getState(this_00);
        if (FVar2 != FINISHED) {
          bye.dest_id.gid = (this_00->global_id)._M_i.gid;
          FederateState::addAction(this_00,&bye);
        }
        gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
        operator++(&__begin3);
      }
      ActionMessage::ActionMessage((ActionMessage *)&__begin3,cmd_stop);
      BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)&__begin3);
      ActionMessage::~ActionMessage((ActionMessage *)&__begin3);
      ActionMessage::~ActionMessage(&bye);
    }
  }
  return;
}

Assistant:

void CommonCore::processTimingTick(ActionMessage& cmd)
{
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::PING_RESPONSE) ||
        isReasonForTick(cmd.messageID, TickForwardingReasons::NO_COMMS)) {
        if (getBrokerState() == BrokerState::OPERATING) {
            timeoutMon->tick(this);
            LOG_SUMMARY(global_broker_id_local, getIdentifier(), " core tick");
        }
    }
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::QUERY_TIMEOUT)) {
        checkQueryTimeouts();
    }
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::DISCONNECT_TIMEOUT)) {
        auto now = std::chrono::steady_clock::now();
        if (now - disconnectTime > (3 * tickTimer).to_ms()) {
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        " disconnect Timer expired forcing disconnect");
            ActionMessage bye(CMD_DISCONNECT_FED_ACK);
            bye.source_id = parent_broker_id;
            for (FedInfo fed : loopFederates) {
                if (fed->getState() != FederateStates::FINISHED) {
                    bye.dest_id = fed->global_id.load();
                    fed->addAction(bye);
                }
            }
            addActionMessage(CMD_STOP);
        }
    }
}